

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_atomic.h
# Opt level: O2

int density::detail::mem_order_cnv(memory_order i_order)

{
  memory_order mVar1;
  
  mVar1 = memory_order_seq_cst;
  if (i_order < memory_order_seq_cst) {
    mVar1 = i_order;
  }
  return mVar1;
}

Assistant:

inline int mem_order_cnv(std::memory_order i_order)
        {
            switch (i_order)
            {
            case std::memory_order_acq_rel:
                return __ATOMIC_ACQ_REL;
            case std::memory_order_acquire:
                return __ATOMIC_ACQUIRE;
            case std::memory_order_consume:
                return __ATOMIC_CONSUME;
            case std::memory_order_relaxed:
                return __ATOMIC_RELAXED;
            case std::memory_order_release:
                return __ATOMIC_RELEASE;
            case std::memory_order_seq_cst:
            default:
                return __ATOMIC_SEQ_CST;
            }
        }